

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMeshFileLoader.cpp
# Opt level: O0

bool __thiscall
irr::scene::CXMeshFileLoader::parseDataObjectAnimationKey(CXMeshFileLoader *this,SJoint *joint)

{
  long *plVar1;
  bool bVar2;
  u32 uVar3;
  float *pfVar4;
  undefined8 in_RSI;
  CXMeshFileLoader *in_RDI;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  double __x_06;
  double __x_07;
  double __x_08;
  double __x_09;
  double __x_10;
  double __x_11;
  double __x_12;
  double __x_13;
  double __x_14;
  double __x_15;
  double __x_16;
  vector3d<float> vVar5;
  SPositionKey *keyP;
  SRotationKey *keyR;
  matrix4 mat;
  SScaleKey *key_2;
  SPositionKey *key_1;
  vector3df vector;
  SRotationKey *key;
  f32 Z;
  f32 Y;
  f32 X;
  f32 W;
  f32 time;
  u32 i;
  u32 numberOfKeys;
  u32 keyType;
  vector3df *in_stack_fffffffffffffd98;
  CXMeshFileLoader *in_stack_fffffffffffffda0;
  uint in_stack_fffffffffffffda8;
  u32 in_stack_fffffffffffffdac;
  uint in_stack_fffffffffffffdbc;
  CXMeshFileLoader *in_stack_fffffffffffffdc0;
  CXMeshFileLoader *in_stack_fffffffffffffdc8;
  undefined8 local_228;
  float local_220;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  CXMeshFileLoader *in_stack_fffffffffffffdf8;
  vector3df local_200 [5];
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  float *local_1b0;
  undefined1 local_188 [156];
  float local_ec;
  float *local_c8;
  f32 local_a0;
  f32 local_9c;
  f32 local_98;
  f32 local_94;
  float local_6c;
  uint local_68;
  u32 local_64;
  u32 local_3c;
  undefined8 local_18;
  bool local_1;
  
  local_18 = in_RSI;
  bVar2 = readHeadOfDataObject
                    (in_stack_fffffffffffffdf8,
                     (stringc *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  if (bVar2) {
    local_3c = readInt((CXMeshFileLoader *)
                       CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    if (local_3c < 5) {
      local_64 = readInt((CXMeshFileLoader *)
                         CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      if (local_64 == 0) {
        checkForOneFollowingSemicolons(in_stack_fffffffffffffdc8);
      }
      for (local_68 = 0; local_68 < local_64; local_68 = local_68 + 1) {
        uVar3 = readInt((CXMeshFileLoader *)
                        CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        local_6c = (float)uVar3;
        in_stack_fffffffffffffdac = local_3c;
        if (local_3c == 0) {
          uVar3 = readInt((CXMeshFileLoader *)(ulong)in_stack_fffffffffffffda8);
          if (uVar3 != 4) {
            os::Printer::log((Printer *)"Expected 4 numbers in animation key in x file",__x_03);
            core::string<char>::string
                      ((string<char> *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
            core::string<char>::c_str((string<char> *)0x2e8c57);
            os::Printer::log(__x_04);
            core::string<char>::~string((string<char> *)0x2e8c78);
            in_RDI->ErrorState = true;
            return false;
          }
          local_94 = readFloat((CXMeshFileLoader *)
                               CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
          local_94 = (f32)-(float)local_94;
          local_98 = readFloat((CXMeshFileLoader *)
                               CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
          local_98 = (f32)-(float)local_98;
          local_9c = readFloat((CXMeshFileLoader *)
                               CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
          local_9c = (f32)-(float)local_9c;
          local_a0 = readFloat((CXMeshFileLoader *)
                               CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
          local_a0 = (f32)-(float)local_a0;
          bVar2 = checkForTwoFollowingSemicolons(in_stack_fffffffffffffdc8);
          if (!bVar2) {
            os::Printer::log((Printer *)
                             "No finishing semicolon after quaternion animation key in x file",
                             __x_05);
            core::string<char>::string
                      ((string<char> *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
            core::string<char>::c_str((string<char> *)0x2e8d4f);
            os::Printer::log(__x_06);
            core::string<char>::~string((string<char> *)0x2e8d70);
          }
          plVar1 = *(long **)&(in_RDI->super_IMeshLoader).field_0x8;
          local_c8 = (float *)(**(code **)(*plVar1 + 0x118))(plVar1,local_18);
          *local_c8 = local_6c;
          core::quaternion::set((quaternion *)(local_c8 + 1),local_98,local_9c,local_a0,local_94);
          core::quaternion::normalize((quaternion *)in_stack_fffffffffffffda0);
        }
        else if (local_3c - 1 < 2) {
          uVar3 = readInt((CXMeshFileLoader *)CONCAT44(local_3c,in_stack_fffffffffffffda8));
          if (uVar3 != 3) {
            os::Printer::log((Printer *)"Expected 3 numbers in animation key in x file",__x_07);
            core::string<char>::string
                      ((string<char> *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
            core::string<char>::c_str((string<char> *)0x2e8e34);
            os::Printer::log(__x_08);
            core::string<char>::~string((string<char> *)0x2e8e55);
            in_RDI->ErrorState = true;
            return false;
          }
          core::vector3d<float>::vector3d((vector3d<float> *)(local_188 + 0x94));
          readVector3(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
          bVar2 = checkForTwoFollowingSemicolons(in_stack_fffffffffffffdc8);
          if (!bVar2) {
            os::Printer::log((Printer *)
                             "No finishing semicolon after vector animation key in x file",__x_09);
            core::string<char>::string
                      ((string<char> *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
            core::string<char>::c_str((string<char> *)0x2e8ecb);
            os::Printer::log(__x_10);
            core::string<char>::~string((string<char> *)0x2e8eec);
          }
          if (local_3c == 2) {
            plVar1 = *(long **)&(in_RDI->super_IMeshLoader).field_0x8;
            local_188._104_8_ = (**(code **)(*plVar1 + 0x108))(plVar1,local_18);
            *(float *)local_188._104_8_ = local_6c;
            *(undefined8 *)(local_188._104_8_ + 4) = local_188._148_8_;
            *(float *)(local_188._104_8_ + 0xc) = local_ec;
          }
          else {
            plVar1 = *(long **)&(in_RDI->super_IMeshLoader).field_0x8;
            local_188._96_8_ = (**(code **)(*plVar1 + 0x110))(plVar1,local_18);
            *(float *)local_188._96_8_ = local_6c;
            *(undefined8 *)(local_188._96_8_ + 4) = local_188._148_8_;
            *(float *)(local_188._96_8_ + 0xc) = local_ec;
          }
        }
        else if (local_3c - 3 < 2) {
          uVar3 = readInt((CXMeshFileLoader *)CONCAT44(local_3c,in_stack_fffffffffffffda8));
          if (uVar3 != 0x10) {
            os::Printer::log((Printer *)"Expected 16 numbers in animation key in x file",__x_11);
            core::string<char>::string
                      ((string<char> *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
            core::string<char>::c_str((string<char> *)0x2e8fe9);
            os::Printer::log(__x_12);
            core::string<char>::~string((string<char> *)0x2e900a);
            in_RDI->ErrorState = true;
            return false;
          }
          core::CMatrix4<float>::CMatrix4
                    ((CMatrix4<float> *)in_stack_fffffffffffffda0,
                     (eConstructor)((ulong)in_stack_fffffffffffffd98 >> 0x20));
          readMatrix(in_RDI,(matrix4 *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8)
                    );
          bVar2 = checkForOneFollowingSemicolons(in_stack_fffffffffffffdc8);
          if (!bVar2) {
            os::Printer::log((Printer *)
                             "No finishing semicolon after matrix animation key in x file",__x_13);
            core::string<char>::string
                      ((string<char> *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
            core::string<char>::c_str((string<char> *)0x2e9082);
            os::Printer::log(__x_14);
            core::string<char>::~string((string<char> *)0x2e90a3);
          }
          plVar1 = *(long **)&(in_RDI->super_IMeshLoader).field_0x8;
          local_1b0 = (float *)(**(code **)(*plVar1 + 0x118))(plVar1,local_18);
          *local_1b0 = local_6c;
          in_stack_fffffffffffffd98 = local_200;
          in_stack_fffffffffffffda0 = (CXMeshFileLoader *)local_188;
          core::CMatrix4<float>::getTransposed
                    ((CMatrix4<float> *)
                     CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
          core::quaternion::quaternion
                    ((quaternion *)in_stack_fffffffffffffda0,(matrix4 *)in_stack_fffffffffffffd98);
          *(undefined8 *)(local_1b0 + 1) = local_1c0;
          *(undefined8 *)(local_1b0 + 3) = uStack_1b8;
          plVar1 = *(long **)&(in_RDI->super_IMeshLoader).field_0x8;
          pfVar4 = (float *)(**(code **)(*plVar1 + 0x108))(plVar1,local_18);
          *pfVar4 = local_6c;
          vVar5 = core::CMatrix4<float>::getTranslation
                            ((CMatrix4<float> *)in_stack_fffffffffffffda0);
          local_228 = vVar5._0_8_;
          local_220 = vVar5.Z;
          *(undefined8 *)(pfVar4 + 1) = local_228;
          pfVar4[3] = local_220;
        }
      }
      bVar2 = checkForOneFollowingSemicolons(in_stack_fffffffffffffdc8);
      if (!bVar2) {
        *(long *)&(in_RDI->super_IMeshLoader).field_0x18 =
             *(long *)&(in_RDI->super_IMeshLoader).field_0x18 + -1;
      }
      bVar2 = checkForClosingBrace(in_stack_fffffffffffffdc0);
      if (bVar2) {
        local_1 = true;
      }
      else {
        os::Printer::log((Printer *)"No closing brace in animation key in x file",__x_15);
        core::string<char>::string
                  ((string<char> *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
        core::string<char>::c_str((string<char> *)0x2e9200);
        os::Printer::log(__x_16);
        core::string<char>::~string((string<char> *)0x2e921e);
        in_RDI->ErrorState = true;
        local_1 = false;
      }
    }
    else {
      os::Printer::log((Printer *)"Unknown key type found in Animation Key in x file",__x_01);
      core::string<char>::string
                ((string<char> *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
      core::string<char>::c_str((string<char> *)0x2e8b49);
      os::Printer::log(__x_02);
      core::string<char>::~string((string<char> *)0x2e8b6a);
      in_RDI->ErrorState = true;
      local_1 = false;
    }
  }
  else {
    os::Printer::log((Printer *)"No opening brace in Animation Key found in x file",__x);
    core::string<char>::string((string<char> *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
    core::string<char>::c_str((string<char> *)0x2e8ac4);
    os::Printer::log(__x_00);
    core::string<char>::~string((string<char> *)0x2e8ae5);
    in_RDI->ErrorState = true;
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool CXMeshFileLoader::parseDataObjectAnimationKey(ISkinnedMesh::SJoint *joint)
{
#ifdef _XREADER_DEBUG
	os::Printer::log("CXFileReader: reading animation key", ELL_DEBUG);
#endif

	if (!readHeadOfDataObject()) {
		os::Printer::log("No opening brace in Animation Key found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	// read key type

	const u32 keyType = readInt();

	if (keyType > 4) {
		os::Printer::log("Unknown key type found in Animation Key in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	// read number of keys
	const u32 numberOfKeys = readInt();

	// eat the semicolon after the "0".  if there are keys present, readInt()
	// does this for us.  If there aren't, we need to do it explicitly
	if (numberOfKeys == 0)
		checkForOneFollowingSemicolons();

	for (u32 i = 0; i < numberOfKeys; ++i) {
		// read time
		const f32 time = (f32)readInt();

		// read keys
		switch (keyType) {
		case 0: // rotation
		{
			// read quaternions

			// read count
			if (readInt() != 4) {
				os::Printer::log("Expected 4 numbers in animation key in x file", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
				SET_ERR_AND_RETURN();
			}

			f32 W = -readFloat();
			f32 X = -readFloat();
			f32 Y = -readFloat();
			f32 Z = -readFloat();

			if (!checkForTwoFollowingSemicolons()) {
				os::Printer::log("No finishing semicolon after quaternion animation key in x file", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
			}

			ISkinnedMesh::SRotationKey *key = AnimatedMesh->addRotationKey(joint);
			key->frame = time;
			key->rotation.set(X, Y, Z, W);
			key->rotation.normalize();
		} break;
		case 1: // scale
		case 2: // position
		{
			// read vectors

			// read count
			if (readInt() != 3) {
				os::Printer::log("Expected 3 numbers in animation key in x file", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
				SET_ERR_AND_RETURN();
			}

			core::vector3df vector;
			readVector3(vector);

			if (!checkForTwoFollowingSemicolons()) {
				os::Printer::log("No finishing semicolon after vector animation key in x file", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
			}

			if (keyType == 2) {
				ISkinnedMesh::SPositionKey *key = AnimatedMesh->addPositionKey(joint);
				key->frame = time;
				key->position = vector;
			} else {
				ISkinnedMesh::SScaleKey *key = AnimatedMesh->addScaleKey(joint);
				key->frame = time;
				key->scale = vector;
			}
		} break;
		case 3:
		case 4: {
			// read matrix

			// read count
			if (readInt() != 16) {
				os::Printer::log("Expected 16 numbers in animation key in x file", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
				SET_ERR_AND_RETURN();
			}

			// read matrix
			core::matrix4 mat(core::matrix4::EM4CONST_NOTHING);
			readMatrix(mat);

			// mat=joint->LocalMatrix*mat;

			if (!checkForOneFollowingSemicolons()) {
				os::Printer::log("No finishing semicolon after matrix animation key in x file", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
			}

			// core::vector3df rotation = mat.getRotationDegrees();

			ISkinnedMesh::SRotationKey *keyR = AnimatedMesh->addRotationKey(joint);
			keyR->frame = time;

			// IRR_TEST_BROKEN_QUATERNION_USE: TODO - switched from mat to mat.getTransposed() for downward compatibility.
			// Not tested so far if this was correct or wrong before quaternion fix!
			keyR->rotation = core::quaternion(mat.getTransposed());

			ISkinnedMesh::SPositionKey *keyP = AnimatedMesh->addPositionKey(joint);
			keyP->frame = time;
			keyP->position = mat.getTranslation();

			/*
							core::vector3df scale=mat.getScale();

							if (scale.X==0)
								scale.X=1;
							if (scale.Y==0)
								scale.Y=1;
							if (scale.Z==0)
								scale.Z=1;
							ISkinnedMesh::SScaleKey *keyS=AnimatedMesh->addScaleKey(joint);
							keyS->frame=time;
							keyS->scale=scale;
			*/
		} break;
		} // end switch
	}

	if (!checkForOneFollowingSemicolons())
		--P;

	if (!checkForClosingBrace()) {
		os::Printer::log("No closing brace in animation key in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	return true;
}